

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::RootToThisObject(Var object,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  TypeId TVar4;
  undefined4 *puVar5;
  RecyclableObject *this;
  JavascriptLibrary *this_00;
  GlobalObject *this_01;
  TypeId typeId;
  Var thisVar;
  ScriptContext *scriptContext_local;
  Var object_local;
  TypeId local_18;
  TypeId typeId_1;
  
  if (object == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(object);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(object);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      this = UnsafeVarTo<Js::RecyclableObject>(object);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(this);
      if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(this), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
  }
  if (local_18 == TypeIds_GlobalObject) {
    object_local = GlobalObject::ToThis((GlobalObject *)object);
  }
  else if (local_18 == TypeIds_LastTrueJavascriptObjectType) {
    object_local = GetThisFromModuleRoot(object);
  }
  else {
    TVar4 = ScriptContext::GetDirectHostTypeId(scriptContext);
    object_local = object;
    if (local_18 == TVar4) {
      this_00 = RecyclableObject::GetLibrary((RecyclableObject *)object);
      this_01 = JavascriptLibrary::GetGlobalObject(this_00);
      object_local = GlobalObject::ToThis(this_01);
    }
  }
  return object_local;
}

Assistant:

Var JavascriptOperators::RootToThisObject(const Var object, ScriptContext* scriptContext)
    {
        Js::Var thisVar = object;
        TypeId typeId = Js::JavascriptOperators::GetTypeId(thisVar);

        switch (typeId)
        {
        case Js::TypeIds_GlobalObject:
            return ((Js::GlobalObject*)thisVar)->ToThis();

        case Js::TypeIds_ModuleRoot:
            return Js::JavascriptOperators::GetThisFromModuleRoot(thisVar);

        default:
            if (typeId == scriptContext->GetDirectHostTypeId())
            {
                return ((RecyclableObject*)thisVar)->GetLibrary()->GetGlobalObject()->ToThis();
            }

        }

        return thisVar;
    }